

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int xmlListAppend(xmlListPtr l,void *data)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  _xmlLink *p_Var3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  int iVar6;
  xmlLinkPtr pxVar7;
  
  iVar6 = 1;
  if (l != (xmlListPtr)0x0) {
    pxVar7 = l->sentinel;
    do {
      pxVar7 = pxVar7->prev;
      if (pxVar7 == l->sentinel) break;
      iVar2 = (*l->linkCompare)(pxVar7->data,data);
    } while (0 < iVar2);
    p_Var3 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var3 == (_xmlLink *)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var1 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar5,"Cannot initialize memory for new link");
    }
    else {
      p_Var3->data = data;
      p_Var3->next = pxVar7->next;
      pxVar7->next->prev = p_Var3;
      pxVar7->next = p_Var3;
      p_Var3->prev = pxVar7;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int xmlListAppend(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListHigherSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (1);
    }
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}